

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locmap.cpp
# Opt level: O1

uint32_t getHostID(ILcidPosixMap *this_0,char *posixID,UErrorCode *status)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  ulong in_RCX;
  ILcidPosixElement *pIVar4;
  ulong uVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  
  sVar2 = strlen(posixID);
  uVar5 = 0;
  if ((ulong)this_0->numRegions == 0) {
    lVar3 = 0;
  }
  else {
    pIVar4 = this_0->regionMaps;
    uVar8 = 0;
    uVar9 = 0;
    do {
      uVar10 = 0;
      if ((*posixID != '\0') && (*posixID == *pIVar4[uVar8].posixID)) {
        uVar7 = 0;
        do {
          lVar3 = uVar7 + 1;
          uVar10 = uVar7 + 1;
          if (posixID[lVar3] == '\0') break;
          lVar1 = uVar7 + 1;
          uVar7 = uVar10;
        } while (posixID[lVar3] == pIVar4[uVar8].posixID[lVar1]);
      }
      bVar6 = true;
      if (((int)uVar9 < (int)uVar10) && (pIVar4[uVar8].posixID[uVar10 & 0xffffffff] == '\0')) {
        uVar7 = uVar8 & 0xffffffff;
        if ((int)uVar10 == (int)sVar2) {
          in_RCX = (ulong)pIVar4[uVar8].hostID;
          bVar6 = false;
          goto LAB_00306924;
        }
      }
      else {
LAB_00306924:
        uVar10 = (ulong)uVar9;
        uVar7 = uVar5;
      }
      uVar5 = uVar7;
      if (!bVar6) {
        return (uint32_t)in_RCX;
      }
      uVar8 = uVar8 + 1;
      iVar11 = (int)uVar5;
      uVar9 = (uint)uVar10;
    } while (uVar8 != this_0->numRegions);
    uVar5 = uVar10 & 0xffffffff;
    lVar3 = (long)iVar11;
  }
  if ((posixID[uVar5] == '_') || (posixID[uVar5] == '@')) {
    pIVar4 = this_0->regionMaps;
    if (pIVar4[lVar3].posixID[uVar5] == '\0') {
      *status = U_ERROR_WARNING_START;
      pIVar4 = pIVar4 + lVar3;
      goto LAB_00306982;
    }
  }
  *status = U_ILLEGAL_ARGUMENT_ERROR;
  pIVar4 = this_0->regionMaps;
LAB_00306982:
  return pIVar4->hostID;
}

Assistant:

static uint32_t
getHostID(const ILcidPosixMap *this_0, const char* posixID, UErrorCode* status)
{
    int32_t bestIdx = 0;
    int32_t bestIdxDiff = 0;
    int32_t posixIDlen = (int32_t)uprv_strlen(posixID);
    uint32_t idx;

    for (idx = 0; idx < this_0->numRegions; idx++ ) {
        int32_t sameChars = idCmp(posixID, this_0->regionMaps[idx].posixID);
        if (sameChars > bestIdxDiff && this_0->regionMaps[idx].posixID[sameChars] == 0) {
            if (posixIDlen == sameChars) {
                /* Exact match */
                return this_0->regionMaps[idx].hostID;
            }
            bestIdxDiff = sameChars;
            bestIdx = idx;
        }
    }
    /* We asked for something unusual, like en_ZZ, and we try to return the number for the same language. */
    /* We also have to make sure that sid and si and similar string subsets don't match. */
    if ((posixID[bestIdxDiff] == '_' || posixID[bestIdxDiff] == '@')
        && this_0->regionMaps[bestIdx].posixID[bestIdxDiff] == 0)
    {
        *status = U_USING_FALLBACK_WARNING;
        return this_0->regionMaps[bestIdx].hostID;
    }

    /*no match found */
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return this_0->regionMaps->hostID;
}